

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isAlterableTable(Parse *pParse,Table *pTab)

{
  int iVar1;
  Table *pTab_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3_strnicmp(pTab->zName,"sqlite_",7);
  if ((iVar1 == 0) ||
     ((((pTab->tabFlags & 0x400) != 0 && ((pParse->db->flags & 0x10000000) != 0)) &&
      (pParse->db->nVdbeExec == 0)))) {
    sqlite3ErrorMsg(pParse,"table %s may not be altered",pTab->zName);
    pParse_local._4_4_ = 1;
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int isAlterableTable(Parse *pParse, Table *pTab){
  if( 0==sqlite3StrNICmp(pTab->zName, "sqlite_", 7) 
#ifndef SQLITE_OMIT_VIRTUALTABLE
   || ( (pTab->tabFlags & TF_Shadow) 
     && (pParse->db->flags & SQLITE_Defensive)
     && pParse->db->nVdbeExec==0
   )
#endif
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be altered", pTab->zName);
    return 1;
  }
  return 0;
}